

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
::storage(storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
          *this,random_engine *rng,quadratic_cost_type<long_double> *costs_,double cost_constant_,
         int population_size,int variables,
         vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         *constraints_)

{
  vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
  *this_00;
  bit_array *this_01;
  uint uVar1;
  raw_result<baryonyx::itm::maximize_tag> *prVar2;
  unsigned_long *puVar3;
  pointer pmVar4;
  pointer pfVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> uVar9;
  size_t sVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  raw_result<baryonyx::itm::maximize_tag> *elem;
  raw_result<baryonyx::itm::maximize_tag> *prVar14;
  uint uVar15;
  ulong uVar16;
  pointer pfVar17;
  long lVar18;
  ulong uVar19;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  uint uVar20;
  pointer prVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 in_XMM3_Qb;
  vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
  *__range3;
  raw_result<baryonyx::itm::maximize_tag> local_68;
  
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->m_indices_mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x30) = 0;
  (this->m_indices_mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x18) = 0;
  local_68.value = cost_constant_;
  local_68.duration = (double)constraints_;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->m_indices,(long)population_size,(allocator_type *)&local_68);
  this_00 = &this->m_data;
  std::
  vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
  ::vector(this_00,(long)population_size,(allocator_type *)&local_68);
  this_01 = &this->m_bastert;
  bit_array_impl::bit_array_impl(&this_01->super_bit_array_impl,variables);
  bit_array_impl::bit_array_impl(&(this->m_random).super_bit_array_impl,variables);
  this->costs = costs_;
  this->cost_constant = local_68.value;
  this->m_size = population_size;
  prVar2 = (this->m_data).
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar14 = (this->m_data).
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; prVar14 != prVar2; prVar14 = prVar14 + 1
      ) {
    bit_array_impl::bit_array_impl((bit_array_impl *)&local_68,variables);
    uVar9._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         local_68.x.super_bit_array_impl.m_data._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    if (prVar14 != &local_68) {
      (prVar14->x).super_bit_array_impl.m_size = local_68.x.super_bit_array_impl.m_size;
      (prVar14->x).super_bit_array_impl.m_block_size = local_68.x.super_bit_array_impl.m_block_size;
      local_68.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      puVar3 = (prVar14->x).super_bit_array_impl.m_data._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (prVar14->x).super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (unsigned_long *)
           uVar9._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      if (puVar3 != (unsigned_long *)0x0) {
        operator_delete__(puVar3);
      }
    }
    if (local_68.x.super_bit_array_impl.m_data._M_t.
        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
      operator_delete__((void *)local_68.x.super_bit_array_impl.m_data._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
    }
  }
  init_with_bastert<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>
            (this_01,costs_,variables,0);
  if (2 < this->m_size + 1U) {
    uVar20 = this->m_size / 2;
    uVar22 = 0;
    do {
      bit_array_impl::operator=
                ((bit_array_impl *)
                 ((this_00->
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar22),
                 &this_01->super_bit_array_impl);
      if (variables != 0) {
        auVar24._0_8_ = (double)(int)uVar22 / (double)(int)(uVar20 * 5);
        auVar24._8_8_ = in_XMM3_Qb;
        auVar7 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar24);
        uVar8 = vcmpsd_avx512f(auVar24,ZEXT816(0),1);
        local_68.hash = (ulong)!(bool)((byte)uVar8 & 1) * auVar7._0_8_;
        local_68.loop = auVar7._8_8_;
        iVar12 = 0;
        do {
          dVar23 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (rng);
          if (dVar23 < (double)local_68.hash) {
            bit_array_impl::invert
                      ((bit_array_impl *)
                       ((this_00->
                        super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar22),iVar12);
          }
          iVar12 = iVar12 + 1;
        } while (variables != iVar12);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar20);
  }
  iVar12 = this->m_size;
  uVar20 = iVar12 / 2 + 1;
  uVar22 = (ulong)uVar20;
  if ((int)uVar20 < iVar12) {
    lVar18 = (long)(iVar12 / 2);
    do {
      local_68.hash = lVar18 * 0x38;
      if (variables != 0) {
        prVar21 = (this_00->
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar18;
        iVar13 = 0;
        do {
          dVar23 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (rng);
          if (0.2 <= dVar23) {
            bit_array_impl::unset((bit_array_impl *)prVar21,iVar13);
          }
          else {
            bit_array_impl::set((bit_array_impl *)prVar21,iVar13);
          }
          iVar13 = iVar13 + 1;
        } while (variables != iVar13);
      }
      if (variables != 0) {
        prVar21 = (this_00->
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + (int)uVar22;
        iVar13 = 0;
        do {
          dVar23 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (rng);
          if (0.8 <= dVar23) {
            bit_array_impl::unset((bit_array_impl *)prVar21,iVar13);
          }
          else {
            bit_array_impl::set((bit_array_impl *)prVar21,iVar13);
          }
          iVar13 = iVar13 + 1;
        } while (variables != iVar13);
      }
      prVar21 = (this_00->
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      auVar25._0_8_ = (double)(int)lVar18 / (double)(iVar12 * 5);
      auVar25._8_8_ = in_XMM3_Qb;
      auVar7 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar25);
      uVar8 = vcmpsd_avx512f(auVar25,ZEXT816(0) << 0x40,1);
      init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>
                ((bit_array *)((long)&(prVar21->x).super_bit_array_impl.m_size + local_68.hash),
                 &prVar21[(int)uVar22].x,rng,costs_,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)local_68.duration,(double)((ulong)!(bool)((byte)uVar8 & 1) * auVar7._0_8_));
      uVar19 = lVar18 + 3;
      uVar22 = uVar19 & 0xffffffff;
      lVar18 = lVar18 + 2;
    } while ((long)uVar19 < (long)iVar12);
  }
  uVar20 = this->m_size;
  if ((ulong)uVar20 != 0) {
    uVar22 = 0;
    do {
      prVar21 = (this->m_data).
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar10 = bit_array_hash::operator()((bit_array_hash *)&local_68,&prVar21[uVar22].x);
      prVar21[uVar22].hash = sVar10;
      dVar23 = quadratic_cost_type<long_double>::results
                         (this->costs,
                          &(this->m_data).
                           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar22].x,local_68.value);
      prVar21 = (this->m_data).
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      prVar21[uVar22].value = dVar23;
      prVar21[uVar22].remaining_constraints = 0;
      pmVar4 = (((_Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)local_68.duration)->_M_impl).super__Vector_impl_data._M_start;
      uVar19 = ((long)(((_Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         *)local_68.duration)->_M_impl).super__Vector_impl_data._M_finish -
                (long)pmVar4 >> 3) * -0x3333333333333333;
      if ((int)uVar19 != 0) {
        uVar16 = 0;
        do {
          pfVar17 = *(pointer *)
                     &pmVar4[uVar16].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl;
          pfVar5 = *(pointer *)
                    ((long)&pmVar4[uVar16].elements.
                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            ._M_impl + 8);
          if (pfVar17 == pfVar5) {
            iVar12 = 0;
          }
          else {
            iVar12 = 0;
            do {
              uVar1 = pfVar17->variable_index;
              uVar15 = uVar1 + 0x3f;
              if (-1 < (int)uVar1) {
                uVar15 = uVar1;
              }
              iVar13 = 0;
              if ((*(ulong *)((long)prVar21[uVar22].x.super_bit_array_impl.m_data._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t + (long)((int)uVar15 >> 6) * 8) >> ((ulong)uVar1 & 0x3f) &
                  1) != 0) {
                iVar13 = pfVar17->factor;
              }
              iVar12 = iVar12 + iVar13;
              pfVar17 = pfVar17 + 1;
            } while (pfVar17 != pfVar5);
          }
          if ((iVar12 < pmVar4[uVar16].min) || (pmVar4[uVar16].max < iVar12)) {
            prVar21[uVar22].remaining_constraints = prVar21[uVar22].remaining_constraints + 1;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (uVar19 & 0xffffffff));
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar20);
  }
  piVar11 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar6 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar11 != piVar6) {
    iVar12 = 0;
    do {
      *piVar11 = iVar12;
      iVar12 = iVar12 + 1;
      piVar11 = piVar11 + 1;
    } while (piVar11 != piVar6);
  }
  sort(this);
  return;
}

Assistant:

storage(random_engine& rng,
            const Cost& costs_,
            const double cost_constant_,
            const int population_size,
            const int variables,
            const std::vector<merged_constraint>& constraints_)
      : m_indices(population_size)
      , m_data(population_size)
      , m_bastert(variables)
      , m_random(variables)
      , costs(costs_)
      , cost_constant(cost_constant_)
      , m_size(population_size)
    {
        for (auto& elem : m_data)
            elem.x = bit_array(variables);

        init_with_bastert<Cost, Mode>(m_bastert, costs_, variables, 0);

        for (int i = 0, e = m_size / 2; i != e; ++i) {
            m_data[i].x = m_bastert;

            std::bernoulli_distribution dist(
              std::clamp(static_cast<double>(i) / (5 * e), 0.0, 1.0));

            for (int v = 0; v != variables; ++v)
                if (dist(rng))
                    m_data[i].x.invert(v);
        }

        for (int i = m_size / 2, e = m_size; i + 1 < e; i += 2) {
            init_with_random(m_data[i].x, rng, variables, 0.2);
            init_with_random(m_data[i + 1].x, rng, variables, 0.8);

            init_with_pre_solve<Cost, Mode>(
              m_data[i].x,
              m_data[i + 1].x,
              rng,
              costs_,
              constraints_,
              std::clamp(static_cast<double>(i) / (5 * e), 0.0, 1.0));
        }

        for (int i = 0, e = m_size; i != e; ++i) {
            m_data[i].make_hash();
            m_data[i].value = costs.results(m_data[i].x, cost_constant_);
            m_data[i].remaining_constraints = 0;

            for (int k = 0, end_k = length(constraints_); k != end_k; ++k) {
                int sum = 0;
                for (const auto& elem : constraints_[k].elements) {
                    if (m_data[i].x[elem.variable_index])
                        sum += elem.factor;
                }

                if (!(constraints_[k].min <= sum &&
                      sum <= constraints_[k].max))
                    ++m_data[i].remaining_constraints;
            }
        }

        std::iota(std::begin(m_indices), std::end(m_indices), 0);

        sort();
    }